

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VdbeMemShallowCopy(Mem *pTo,Mem *pFrom,int srcType)

{
  int srcType_local;
  Mem *pFrom_local;
  Mem *pTo_local;
  
  if ((pTo->flags & 0x2460) != 0) {
    sqlite3VdbeMemReleaseExternal(pTo);
  }
  memcpy(pTo,pFrom,0x30);
  pTo->xDel = (_func_void_void_ptr *)0x0;
  if ((pFrom->flags & 0x800) == 0) {
    pTo->flags = pTo->flags & 0xe3ff;
    pTo->flags = pTo->flags | (ushort)srcType;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeMemShallowCopy(Mem *pTo, const Mem *pFrom, int srcType){
  assert( (pFrom->flags & MEM_RowSet)==0 );
  VdbeMemRelease(pTo);
  memcpy(pTo, pFrom, MEMCELLSIZE);
  pTo->xDel = 0;
  if( (pFrom->flags&MEM_Static)==0 ){
    pTo->flags &= ~(MEM_Dyn|MEM_Static|MEM_Ephem);
    assert( srcType==MEM_Ephem || srcType==MEM_Static );
    pTo->flags |= srcType;
  }
}